

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  FString *this_00;
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  SBarInfo *pSVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  AInventory *item;
  AInventory *pAVar7;
  AAmmo *pAVar8;
  Node *pNVar9;
  AInventory *pAVar10;
  undefined4 extraout_var;
  long lVar12;
  byte bVar13;
  PClass *pPVar14;
  PClass *pPVar15;
  int iVar16;
  int iVar17;
  BYTE *pBVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  double dVar22;
  PClass *pPVar11;
  
  if ((this->super_CommandDrawString).field_0x5f == '\x01') {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  uVar20 = (this->super_CommandDrawString).valueArgument;
  if (KEYS < this->value) goto LAB_00623370;
  switch(this->value) {
  case HEALTH:
    uVar21 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    uVar20 = 0;
    if (0 < (int)uVar21) {
      uVar20 = uVar21;
    }
    if (pSVar3->lowerHealthCap == false) {
      uVar20 = uVar21;
    }
    if (pSVar3->interpolateHealth == true) {
      iVar5 = pSVar3->interpolationSpeed;
LAB_00623353:
      this->interpolationSpeed = iVar5;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      uVar20 = 0;
    }
    else {
      uVar20 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    if (pSVar3->interpolateArmor == true) {
      iVar5 = pSVar3->armorInterpolationSpeed;
      goto LAB_00623353;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) goto LAB_006233e1;
    uVar20 = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) goto LAB_006233e1;
    uVar20 = statusBar->ammocount2;
    break;
  default:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        this->inventoryItem,false);
    uVar20 = 0;
    if (pAVar7 != (AInventory *)0x0) {
      uVar20 = pAVar7->Amount;
    }
    break;
  case AMMO1CAPACITY:
    pAVar8 = statusBar->ammo1;
    goto LAB_00623161;
  case AMMO2CAPACITY:
    pAVar8 = statusBar->ammo2;
LAB_00623161:
    if (pAVar8 == (AAmmo *)0x0) goto LAB_006233e1;
LAB_006231a6:
    uVar20 = (pAVar8->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar8 = (AAmmo *)AActor::FindInventory
                                (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                                 this->inventoryItem,false);
    if (pAVar8 == (AAmmo *)0x0) {
      pAVar8 = (AAmmo *)(this->inventoryItem->super_PClass).Defaults;
    }
    goto LAB_006231a6;
  case FRAGS:
    uVar20 = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case KILLS:
    uVar20 = level.killed_monsters;
    break;
  case MONSTERS:
    uVar20 = level.total_monsters;
    break;
  case ITEMS:
    uVar20 = level.found_items;
    break;
  case TOTALITEMS:
    uVar20 = level.total_items;
    break;
  case SECRETS:
    uVar20 = level.found_secrets;
    break;
  case TOTALSECRETS:
    uVar20 = level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar7 == (AInventory *)0x0) {
      dVar22 = 0.0;
    }
    else {
      dVar22 = (double)pAVar7[1].super_AActor.super_DThinker.super_DObject._vptr_DObject +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.Class +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjNext +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.GCNext +
               *(double *)&pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjectFlags;
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      dVar22 = dVar22 + statusBar->armor->SavePercent * 100.0;
    }
    if (this->value == ARMORCLASS) {
      dVar22 = dVar22 / 5.0;
    }
    uVar20 = (int)dVar22;
    break;
  case GLOBALVAR:
    uVar20 = ACS_GlobalVars[(int)uVar20];
    break;
  case GLOBALARRAY:
    pNVar9 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::GetNode
                       (ACS_GlobalArrays + (int)uVar20,consoleplayer);
    uVar20 = (pNVar9->Pair).Value;
    break;
  case POWERUPTIME:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        *(PClassActor **)((this->inventoryItem->super_PClass).Defaults + 0x4e0),
                        false);
    if (pAVar7 != (AInventory *)0x0) {
      uVar20 = *(int *)&pAVar7->field_0x4dc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    ppVar1 = (statusBar->super_DBaseStatusBar).CPlayer;
    if ((ppVar1->mo->super_AActor).waterlevel < 3) {
      uVar20 = level.airsupply / 0x23;
    }
    else {
      iVar5 = ppVar1->air_finished - level.time;
      iVar5 = iVar5 + (int)((ulong)((long)(iVar5 + 0x22) * -0x15f15f15) >> 0x20) + 0x22;
      uVar21 = (iVar5 >> 5) - (iVar5 >> 0x1f);
      uVar20 = 0;
      if (0 < (int)uVar21) {
        uVar20 = uVar21;
      }
    }
    break;
  case SELECTEDINVENTORY:
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar7 = (pAVar2->InvSel).field_0.p;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar20 = pAVar7->Amount;
      }
      else {
        (pAVar2->InvSel).field_0.p = (AInventory *)0x0;
      }
    }
    break;
  case SCORE:
    uVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    uVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    uVar20 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar7 = (pAVar2->super_AActor).Inventory.field_0.p;
    uVar20 = 0;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar20 = 0;
        pPVar14 = AKey::RegistrationInfo.MyClass;
        do {
          pAVar10 = pAVar7;
          pPVar11 = (pAVar10->super_AActor).super_DThinker.super_DObject.Class;
          pPVar15 = pPVar14;
          if (pPVar11 == (PClass *)0x0) {
            iVar5 = (**(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar10);
            pPVar11 = (PClass *)CONCAT44(extraout_var,iVar5);
            (pAVar10->super_AActor).super_DThinker.super_DObject.Class = pPVar11;
            pPVar15 = AKey::RegistrationInfo.MyClass;
          }
          uVar21 = (uint)(pPVar11 != (PClass *)0x0);
          if (pPVar11 != pPVar14 && pPVar11 != (PClass *)0x0) {
            do {
              pPVar11 = pPVar11->ParentClass;
              uVar21 = (uint)(pPVar11 != (PClass *)0x0);
              if (pPVar11 == pPVar14) break;
            } while (pPVar11 != (PClass *)0x0);
          }
          uVar20 = uVar20 + uVar21;
          pAVar7 = (pAVar10->super_AActor).Inventory.field_0.p;
          if (pAVar7 == (AInventory *)0x0) goto LAB_00623370;
          pPVar14 = pPVar15;
        } while (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        (pAVar10->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
      else {
        (pAVar2->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        uVar20 = 0;
      }
    }
  }
LAB_00623370:
  iVar5 = this->interpolationSpeed;
  if ((iVar5 == 0) || ((hudChanged && (level.time != 1)))) {
LAB_00623388:
    this->drawValue = uVar20;
    uVar21 = uVar20;
  }
  else {
    uVar21 = this->drawValue;
    if ((int)uVar20 < (int)uVar21) {
      iVar16 = (int)(uVar21 - uVar20) >> 2;
      if (iVar16 < iVar5) {
        iVar5 = iVar16;
      }
      iVar17 = 1;
      if (1 < iVar16) {
        iVar17 = iVar5;
      }
      uVar21 = uVar21 - iVar17;
      this->drawValue = uVar21;
    }
    else if (uVar20 - uVar21 != 0 && (int)uVar21 <= (int)uVar20) {
      iVar16 = (int)(uVar20 - uVar21) >> 2;
      if (iVar16 < iVar5) {
        iVar5 = iVar16;
      }
      iVar17 = 1;
      if (1 < iVar16) {
        iVar17 = iVar5;
      }
      uVar20 = iVar17 + uVar21;
      goto LAB_00623388;
    }
  }
  if (((this->super_CommandDrawString).field_0x5d == '\x01') && (uVar21 == 0)) {
LAB_006233e1:
    FString::operator=(&(this->super_CommandDrawString).str,(char *)"");
    return;
  }
  iVar5 = this->lowValue;
  (this->super_CommandDrawString).translation = this->normalTranslation;
  if (((iVar5 != -1) && (lVar12 = 0x70, (int)uVar21 <= iVar5)) ||
     ((this->highValue != -1 && (lVar12 = 0x78, this->highValue <= (int)uVar21)))) {
    (this->super_CommandDrawString).translation =
         *(EColorRange *)
          ((long)&(this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand +
          lVar12);
  }
  bVar19 = (this->super_CommandDrawString).field_0x5c;
  iVar5 = this->length;
  if ((this->super_CommandDrawString).field_0x5e == '\0') {
    uVar21 = 0x7fffffff;
    bVar13 = bVar19;
    if (iVar5 < 10) {
      dVar22 = pow(10.0,(double)iVar5);
      dVar22 = ceil(dVar22);
      uVar21 = (int)dVar22 - 1;
      bVar13 = (this->super_CommandDrawString).field_0x5c;
    }
    if ((bVar13 & 1) == 0) {
      uVar20 = this->drawValue;
LAB_00623515:
      uVar6 = -uVar21;
    }
    else {
      uVar20 = this->drawValue;
      iVar5 = this->length;
      if (iVar5 == 1) goto LAB_00623515;
      uVar6 = 0x80000000;
      if (iVar5 < 10) {
        dVar22 = pow(10.0,(double)(iVar5 + -1));
        dVar22 = ceil(dVar22);
        uVar6 = (uint)-(dVar22 + -1.0);
      }
    }
    if ((int)uVar20 < (int)uVar21) {
      uVar21 = uVar20;
    }
    if ((int)uVar20 <= (int)uVar6) {
      uVar21 = uVar6;
    }
  }
  else {
    if (9 < iVar5) goto LAB_0062352c;
    dVar22 = pow(10.0,(double)(int)(iVar5 - (uint)((int)uVar21 < 0 && 1 < iVar5)));
    dVar22 = ceil(dVar22);
    bVar13 = 1;
    if (this->drawValue < (int)dVar22) {
      bVar13 = bVar19;
    }
    bVar19 = bVar13;
    uVar21 = this->drawValue % (int)dVar22;
  }
  this->drawValue = uVar21;
LAB_0062352c:
  if ((this->super_CommandDrawString).field_0x5f == '\0') {
    pBVar18 = "";
  }
  else {
    pBVar18 = (BYTE *)(this->super_CommandDrawString).str.Chars;
  }
  this_00 = &(this->super_CommandDrawString).str;
  pcVar4 = (this->prefixPadding).Chars;
  if (bVar19 == 0) {
    FString::Format(this_00,"%s%s%d",pBVar18,pcVar4,(ulong)uVar21);
  }
  else {
    FString::Format(this_00,"%s%s%0*d",pBVar18,pcVar4,
                    (ulong)(uint)(((int)uVar21 >> 0x1f) + this->length),(ulong)uVar21);
  }
  CommandDrawString::RealignString(&this->super_CommandDrawString);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}